

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

cio_http_location * find_location(cio_http_server *server,char *request_target,size_t url_length)

{
  _Bool _Var1;
  cio_http_location *location_length_00;
  size_t location_length;
  size_t i;
  cio_http_location *location;
  size_t best_match_length;
  cio_http_location *best_match;
  size_t url_length_local;
  char *request_target_local;
  cio_http_server *server_local;
  
  best_match_length = 0;
  location = (cio_http_location *)0x0;
  i = (size_t)server->first_location;
  for (location_length = 0; location_length < server->num_handlers;
      location_length = location_length + 1) {
    location_length_00 = (cio_http_location *)strlen(*(char **)i);
    _Var1 = location_match(*(char **)i,(size_t)location_length_00,request_target,url_length);
    if ((_Var1) && (location < location_length_00)) {
      best_match_length = i;
      location = location_length_00;
    }
    i = *(size_t *)(i + 0x10);
  }
  return (cio_http_location *)best_match_length;
}

Assistant:

static const struct cio_http_location *find_location(const struct cio_http_server *server, const char *request_target, size_t url_length)
{
	const struct cio_http_location *best_match = NULL;
	size_t best_match_length = 0;

	const struct cio_http_location *location = server->first_location;
	for (size_t i = 0; i < server->num_handlers; i++) {
		size_t location_length = strlen(location->path);
		if ((location_match(location->path, location_length, request_target, url_length)) && (location_length > best_match_length)) {
			best_match_length = location_length;
			best_match = location;
		}

		location = location->next;
	}

	return best_match;
}